

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaHash.c
# Opt level: O2

Gia_Man_t * Gia_ManRehash(Gia_Man_t *p,int fAddStrash)

{
  Vec_Int_t *pVVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  Gia_Man_t *p_00;
  char *pcVar6;
  Gia_Obj_t *pObj;
  Gia_Obj_t *pGVar7;
  Gia_Man_t *pGVar8;
  ulong uVar9;
  int v;
  
  p_00 = Gia_ManStart(p->nObjs);
  pcVar6 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar6;
  pcVar6 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar6;
  p_00->fAddStrash = fAddStrash;
  Gia_ManHashAlloc(p_00);
  p->pObjs->Value = 0;
  for (v = 0; v < p->nObjs; v = v + 1) {
    pObj = Gia_ManObj(p,v);
    if (pObj == (Gia_Obj_t *)0x0) break;
    uVar4 = (uint)*(ulong *)pObj;
    uVar9 = *(ulong *)pObj & 0x1fffffff;
    if (uVar9 == 0x1fffffff || (int)uVar4 < 0) {
      if ((uVar4 & 0x9fffffff) == 0x9fffffff) {
        pGVar7 = Gia_ManAppendObj(p_00);
        uVar9 = *(ulong *)pGVar7;
        *(ulong *)pGVar7 = uVar9 | 0x9fffffff;
        *(ulong *)pGVar7 =
             uVar9 & 0xe0000000ffffffff | 0x9fffffff |
             (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
        pVVar1 = p_00->vCis;
        iVar2 = Gia_ObjId(p_00,pGVar7);
        Vec_IntPush(pVVar1,iVar2);
        iVar2 = Gia_ObjId(p_00,pGVar7);
        uVar4 = iVar2 * 2;
        goto LAB_001ef07c;
      }
      if ((int)uVar4 < 0 && (int)uVar9 != 0x1fffffff) {
        iVar2 = Gia_ObjFanin0Copy(pObj);
        iVar3 = Abc_Lit2Var(iVar2);
        if (p_00->nObjs <= iVar3) {
          __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x314,"int Gia_ManAppendCo(Gia_Man_t *, int)");
        }
        iVar3 = Abc_Lit2Var(iVar2);
        pGVar7 = Gia_ManObj(p_00,iVar3);
        if ((~*(uint *)pGVar7 & 0x1fffffff) != 0 && (int)*(uint *)pGVar7 < 0) {
          __assert_fail("!Gia_ObjIsCo(Gia_ManObj(p, Abc_Lit2Var(iLit0)))",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x315,"int Gia_ManAppendCo(Gia_Man_t *, int)");
        }
        pGVar7 = Gia_ManAppendObj(p_00);
        *(ulong *)pGVar7 = *(ulong *)pGVar7 | 0x80000000;
        iVar3 = Gia_ObjId(p_00,pGVar7);
        iVar5 = Abc_Lit2Var(iVar2);
        *(ulong *)pGVar7 =
             *(ulong *)pGVar7 & 0xffffffffe0000000 | (ulong)(iVar3 - iVar5 & 0x1fffffff);
        iVar2 = Abc_LitIsCompl(iVar2);
        uVar9 = *(ulong *)pGVar7;
        *(ulong *)pGVar7 = uVar9 & 0xffffffffdfffffff | (ulong)(uint)(iVar2 << 0x1d);
        *(ulong *)pGVar7 =
             uVar9 & 0xe0000000dfffffff | (ulong)(uint)(iVar2 << 0x1d) |
             (ulong)(p_00->vCos->nSize & 0x1fffffff) << 0x20;
        pVVar1 = p_00->vCos;
        iVar2 = Gia_ObjId(p_00,pGVar7);
        Vec_IntPush(pVVar1,iVar2);
        if (p_00->pFanData != (int *)0x0) {
          Gia_ObjAddFanout(p_00,pGVar7 + -(ulong)((uint)*(undefined8 *)pGVar7 & 0x1fffffff),pGVar7);
        }
        iVar2 = Gia_ObjId(p_00,pGVar7);
        uVar4 = iVar2 * 2;
        goto LAB_001ef07c;
      }
    }
    else {
      iVar2 = Gia_ObjFanin0Copy(pObj);
      uVar4 = (uint)((ulong)*(undefined8 *)pObj >> 0x20);
      iVar3 = Abc_LitNotCond(pObj[-(ulong)(uVar4 & 0x1fffffff)].Value,uVar4 >> 0x1d & 1);
      uVar4 = Gia_ManHashAnd(p_00,iVar2,iVar3);
LAB_001ef07c:
      pObj->Value = uVar4;
    }
  }
  Gia_ManHashStop(p_00);
  p_00->fAddStrash = 0;
  Gia_ManSetRegNum(p_00,p->nRegs);
  pGVar8 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar8;
}

Assistant:

Gia_Man_t * Gia_ManRehash( Gia_Man_t * p, int fAddStrash )  
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i;
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    pNew->fAddStrash = fAddStrash;
    Gia_ManHashAlloc( pNew );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachObj( p, pObj, i )
    {
        //if ( Gia_ObjIsBuf(pObj) )
        //    pObj->Value = Gia_ManAppendBuf( pNew, Gia_ObjFanin0Copy(pObj) );
        //else 
        if ( Gia_ObjIsAnd(pObj) )
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else if ( Gia_ObjIsCi(pObj) )
            pObj->Value = Gia_ManAppendCi( pNew );
        else if ( Gia_ObjIsCo(pObj) )
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    }
    Gia_ManHashStop( pNew );
    pNew->fAddStrash = 0;
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
//    printf( "Top gate is %s\n", Gia_ObjFaninC0(Gia_ManCo(pNew, 0))? "OR" : "AND" );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}